

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall Clasp::DeleteObject::operator()(DeleteObject *this,Accu *p)

{
  if (p != (Accu *)0x0) {
    ClaspFacade::Statistics::ClingoView::Accu::~Accu(p);
  }
  operator_delete(p);
  return;
}

Assistant:

void operator()(T* p) const { delete p; }